

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transmesh.c
# Opt level: O2

int GetKwdIdx(char *KwdStr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 1;
  lVar3 = 0x18;
  while( true ) {
    if (lVar3 == 0x1698) {
      return 0;
    }
    iVar1 = strcmp(*(char **)((long)GmfKwdFmt[0] + lVar3),KwdStr);
    if (iVar1 == 0) break;
    iVar2 = iVar2 + 1;
    lVar3 = lVar3 + 0x18;
  }
  return iVar2;
}

Assistant:

int GetKwdIdx(char *KwdStr)
{
   int KwdIdx;

   for(KwdIdx=1; KwdIdx<=GmfMaxKwd; KwdIdx++)
      if(!strcmp(GmfKwdFmt[ KwdIdx ][0], KwdStr))
         return(KwdIdx);

   return(0);
}